

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  value_type vVar1;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __last;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  __first;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first_00;
  const_iterator __position;
  const_iterator __position_00;
  bool bVar2;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *pvVar3;
  float *pfVar4;
  size_type sVar5;
  reference pvVar6;
  reference this_00;
  reference pvVar7;
  reference pvVar8;
  undefined8 in_RDX;
  Allocator *in_RSI;
  long in_RDI;
  double dVar9;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  int z;
  int i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int p;
  int pp;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blob;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  int iVar10;
  Mat *in_stack_fffffffffffffb68;
  value_type *__x;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb70;
  iterator in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  float in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  float in_stack_fffffffffffffbb8;
  float in_stack_fffffffffffffbbc;
  float *in_stack_fffffffffffffbf0;
  float fVar11;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbf8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *bboxes;
  int local_3d4;
  int local_3bc;
  vector<float,_std::allocator<float>_> local_3b8;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_3a0;
  vector<int,_std::allocator<int>_> local_388;
  float *local_370;
  float *local_368;
  float *local_360;
  float *local_358;
  BBoxRect *local_348;
  BBoxRect *local_340;
  BBoxRect *local_338;
  BBoxRect *local_330;
  reference local_320;
  reference local_318;
  int local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  int local_2f8;
  float local_2f4;
  Mat local_2f0;
  float local_2ac;
  int local_2a8;
  float local_2a4;
  int local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  int local_278;
  int local_274;
  undefined1 local_270 [64];
  Mat local_230;
  float *local_1f0;
  Mat local_1e8;
  float *local_1a8;
  Mat local_1a0;
  float *local_160;
  Mat local_158;
  float *local_118;
  Mat local_110;
  float *local_d0;
  float local_c4;
  float local_c0;
  int local_bc;
  int local_b8;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_a8;
  vector<int,_std::allocator<int>_> local_90;
  undefined4 local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  reference local_60;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_58;
  vector<float,_std::allocator<float>_> local_50;
  undefined8 local_20;
  Allocator *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1b26bc);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1b26c9);
  local_58 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x0;
  do {
    bboxes = local_58;
    pvVar3 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_18);
    fVar11 = (float)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
    if (pvVar3 <= bboxes) {
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb70,
                 (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb68);
      __x = (value_type *)&local_388;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b328c);
      nms_sorted_bboxes(bboxes,in_stack_fffffffffffffbf8,fVar11);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1b32bd);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1b32ca);
      local_3bc = 0;
      while( true ) {
        iVar10 = local_3bc;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_388);
        if ((int)sVar5 <= iVar10) break;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_388,(long)local_3bc);
        iVar10 = *pvVar6;
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   &stack0xffffffffffffffc8,(long)iVar10);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                   in_stack_fffffffffffffb70,__x);
        std::vector<float,_std::allocator<float>_>::operator[](&local_50,(long)iVar10);
        std::vector<float,_std::allocator<float>_>::push_back(in_stack_fffffffffffffb70,&__x->xmin);
        local_3bc = local_3bc + 1;
      }
      sVar5 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_3a0);
      if ((int)sVar5 == 0) {
        local_4 = 0;
      }
      else {
        this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_18,0);
        Mat::create(in_stack_fffffffffffffb80,
                    (int)((ulong)in_stack_fffffffffffffb78._M_current >> 0x20),
                    (int)in_stack_fffffffffffffb78._M_current,(size_t)in_stack_fffffffffffffb70,
                    (Allocator *)__x);
        bVar2 = Mat::empty((Mat *)CONCAT44(iVar10,in_stack_fffffffffffffb60));
        if (bVar2) {
          local_4 = -100;
        }
        else {
          for (local_3d4 = 0; local_3d4 < (int)sVar5; local_3d4 = local_3d4 + 1) {
            pvVar7 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                               (&local_3a0,(long)local_3d4);
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_3b8,(long)local_3d4);
            vVar1 = *pvVar8;
            pfVar4 = Mat::row(this_00,local_3d4);
            *pfVar4 = (float)(pvVar7->label + 1);
            pfVar4[1] = vVar1;
            pfVar4[2] = pvVar7->xmin;
            pfVar4[3] = pvVar7->ymin;
            pfVar4[4] = pvVar7->xmax;
            pfVar4[5] = pvVar7->ymax;
          }
          local_4 = 0;
        }
      }
      local_74 = 1;
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb70);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb70);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb70);
LAB_001b361e:
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffb70);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffffb70);
      return local_4;
    }
    local_60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_18,
                          (size_type)local_58);
    local_64 = local_60->w;
    local_68 = local_60->h;
    local_6c = local_60->c;
    local_70 = local_6c / *(int *)(in_RDI + 0x84);
    if (local_70 != *(int *)(in_RDI + 0x80) + 5) {
      local_4 = -1;
      local_74 = 1;
      goto LAB_001b361e;
    }
    in_stack_fffffffffffffbf8 = &local_90;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x1b27ba);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x1b27c7);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78._M_current);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78._M_current);
    for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x84); local_b8 = local_b8 + 1) {
      local_bc = local_b8 * local_70;
      in_stack_fffffffffffffbf0 = Mat::operator[]((Mat *)(in_RDI + 0x90),local_b8 * 2);
      local_c0 = *in_stack_fffffffffffffbf0;
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x90),local_b8 * 2 + 1);
      local_c4 = *pfVar4;
      Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
      pfVar4 = Mat::operator_cast_to_float_(&local_110);
      Mat::~Mat((Mat *)0x1b28ff);
      local_d0 = pfVar4;
      Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
      pfVar4 = Mat::operator_cast_to_float_(&local_158);
      Mat::~Mat((Mat *)0x1b2953);
      local_118 = pfVar4;
      Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
      pfVar4 = Mat::operator_cast_to_float_(&local_1a0);
      Mat::~Mat((Mat *)0x1b29a5);
      local_160 = pfVar4;
      Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
      pfVar4 = Mat::operator_cast_to_float_(&local_1e8);
      Mat::~Mat((Mat *)0x1b29f4);
      local_1a8 = pfVar4;
      Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
      pfVar4 = Mat::operator_cast_to_float_(&local_230);
      Mat::~Mat((Mat *)0x1b2a43);
      local_1f0 = pfVar4;
      Mat::channel_range((Mat *)in_stack_fffffffffffffb78._M_current,
                         (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                         (int)in_stack_fffffffffffffb70);
      (**(code **)(**(long **)(in_RDI + 0xd0) + 0x48))(*(long **)(in_RDI + 0xd0),local_270,local_20)
      ;
      for (local_274 = 0; local_274 < local_68; local_274 = local_274 + 1) {
        for (local_278 = 0; local_278 < local_64; local_278 = local_278 + 1) {
          in_stack_fffffffffffffbb8 = (float)local_278;
          in_stack_fffffffffffffbbc = sigmoid(0.0);
          local_27c = (in_stack_fffffffffffffbb8 + in_stack_fffffffffffffbbc) / (float)local_64;
          in_stack_fffffffffffffbb0 = (float)local_274;
          in_stack_fffffffffffffbb4 = sigmoid(0.0);
          local_280 = (in_stack_fffffffffffffbb0 + in_stack_fffffffffffffbb4) / (float)local_68;
          dVar9 = std::exp((double)(ulong)(uint)*local_160);
          in_stack_fffffffffffffbac = SUB84(dVar9,0);
          local_284 = (in_stack_fffffffffffffbac * local_c0) / (float)local_64;
          dVar9 = std::exp((double)(ulong)(uint)*local_1a8);
          in_stack_fffffffffffffba8 = SUB84(dVar9,0);
          local_288 = (in_stack_fffffffffffffba8 * local_c4) / (float)local_68;
          local_28c = local_27c - local_284 * 0.5;
          local_290 = local_280 - local_288 * 0.5;
          local_294 = local_27c + local_284 * 0.5;
          local_298 = local_280 + local_288 * 0.5;
          in_stack_fffffffffffffba4 = sigmoid(0.0);
          local_2a0 = 0;
          local_2a4 = 0.0;
          local_29c = in_stack_fffffffffffffba4;
          for (local_2a8 = 0; local_2a8 < *(int *)(in_RDI + 0x80); local_2a8 = local_2a8 + 1) {
            Mat::channel(in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
            pfVar4 = Mat::row(&local_2f0,local_274);
            fVar11 = pfVar4[local_278];
            Mat::~Mat((Mat *)0x1b2d5e);
            if (local_2a4 < fVar11) {
              local_2a0 = local_2a8;
              local_2a4 = fVar11;
            }
            local_2ac = fVar11;
          }
          local_2f4 = local_29c * local_2a4;
          if (*(float *)(in_RDI + 0x88) <= local_2f4) {
            local_308 = local_28c;
            local_304 = local_290;
            local_300 = local_294;
            local_2fc = local_298;
            local_2f8 = local_2a0;
            std::
            vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ::operator[]((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          *)&local_90,(long)local_b8);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       in_stack_fffffffffffffb70,(value_type *)in_stack_fffffffffffffb68);
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](&local_a8,(long)local_b8);
            std::vector<float,_std::allocator<float>_>::push_back
                      (in_stack_fffffffffffffb70,(value_type_conflict1 *)in_stack_fffffffffffffb68);
          }
          local_d0 = local_d0 + 1;
          local_118 = local_118 + 1;
          local_160 = local_160 + 1;
          local_1a8 = local_1a8 + 1;
          local_1f0 = local_1f0 + 1;
        }
      }
      Mat::~Mat((Mat *)0x1b3055);
    }
    for (local_30c = 0; local_30c < *(int *)(in_RDI + 0x84); local_30c = local_30c + 1) {
      local_318 = std::
                  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ::operator[]((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                *)&local_90,(long)local_30c);
      local_320 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_a8,(long)local_30c);
      in_stack_fffffffffffffb80 = (Mat *)&stack0xffffffffffffffc8;
      local_330 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb58);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                ((__normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffffb58);
      local_338 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb58);
      local_340 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffffb58);
      __position._M_current._4_4_ = in_stack_fffffffffffffbbc;
      __position._M_current._0_4_ = in_stack_fffffffffffffbb8;
      __first._M_current._4_4_ = in_stack_fffffffffffffbb4;
      __first._M_current._0_4_ = in_stack_fffffffffffffbb0;
      __last._M_current._4_4_ = in_stack_fffffffffffffbac;
      __last._M_current._0_4_ = in_stack_fffffffffffffba8;
      local_348 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                  insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             __position,__first,__last);
      in_stack_fffffffffffffb70 = &local_50;
      local_358 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb58);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffffb58);
      local_360 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     (in_stack_fffffffffffffb58);
      local_368 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffffb58);
      __position_00._M_current._4_4_ = in_stack_fffffffffffffbbc;
      __position_00._M_current._0_4_ = in_stack_fffffffffffffbb8;
      __first_00._M_current._4_4_ = in_stack_fffffffffffffbb4;
      __first_00._M_current._0_4_ = in_stack_fffffffffffffbb0;
      __last_00._M_current._4_4_ = in_stack_fffffffffffffbac;
      __last_00._M_current._0_4_ = in_stack_fffffffffffffba8;
      in_stack_fffffffffffffb78 =
           std::vector<float,std::allocator<float>>::
           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                     ((vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),__position_00,
                      __first_00,__last_00);
      local_370 = in_stack_fffffffffffffb78._M_current;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffffb70);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb70);
    local_58 = (vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
               ((long)&(local_58->
                       super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = exp(wptr[0]) * bias_w / w;
                    float bbox_h = exp(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<int> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 0; i < (int)picked.size(); i++)
    {
        int z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1;// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}